

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

void FT_Select_Metrics(FT_Face face,FT_ULong strike_index)

{
  FT_Bitmap_Size *pFVar1;
  FT_Size pFVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  FT_Fixed FVar9;
  ulong uVar10;
  
  pFVar1 = face->available_sizes;
  pFVar2 = face->size;
  lVar6 = pFVar1[strike_index].x_ppem;
  (pFVar2->metrics).x_ppem = (FT_UShort)((int)lVar6 + 0x20U >> 6);
  lVar3 = pFVar1[strike_index].y_ppem;
  (pFVar2->metrics).y_ppem = (FT_UShort)((int)lVar3 + 0x20U >> 6);
  if ((face->face_flags & 1) == 0) {
    (pFVar2->metrics).x_scale = 0x10000;
    (pFVar2->metrics).y_scale = 0x10000;
    (pFVar2->metrics).ascender = lVar3;
    (pFVar2->metrics).descender = 0;
    (pFVar2->metrics).height = (long)pFVar1[strike_index].height << 6;
    (pFVar2->metrics).max_advance = lVar6;
    return;
  }
  uVar7 = (ulong)face->units_per_EM;
  if (uVar7 == 0) {
    FVar9 = -0x7fffffff;
    uVar7 = 0x7fffffff;
    if (-1 < lVar6) {
      FVar9 = 0x7fffffff;
    }
    (pFVar2->metrics).x_scale = FVar9;
  }
  else {
    lVar4 = -lVar6;
    if (0 < lVar6) {
      lVar4 = lVar6;
    }
    uVar10 = (ulong)(face->units_per_EM >> 1);
    uVar5 = (lVar4 << 0x10 | uVar10) / uVar7;
    uVar8 = -uVar5;
    if (-1 < lVar6) {
      uVar8 = uVar5;
    }
    (pFVar2->metrics).x_scale = uVar8;
    lVar6 = -lVar3;
    if (0 < lVar3) {
      lVar6 = lVar3;
    }
    uVar7 = (lVar6 << 0x10 | uVar10) / uVar7;
  }
  uVar8 = -uVar7;
  if (-1 < lVar3) {
    uVar8 = uVar7;
  }
  (pFVar2->metrics).y_scale = uVar8;
  ft_recompute_scaled_metrics(face,&pFVar2->metrics);
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_Select_Metrics( FT_Face   face,
                     FT_ULong  strike_index )
  {
    FT_Size_Metrics*  metrics;
    FT_Bitmap_Size*   bsize;


    metrics = &face->size->metrics;
    bsize   = face->available_sizes + strike_index;

    metrics->x_ppem = (FT_UShort)( ( bsize->x_ppem + 32 ) >> 6 );
    metrics->y_ppem = (FT_UShort)( ( bsize->y_ppem + 32 ) >> 6 );

    if ( FT_IS_SCALABLE( face ) )
    {
      metrics->x_scale = FT_DivFix( bsize->x_ppem,
                                    face->units_per_EM );
      metrics->y_scale = FT_DivFix( bsize->y_ppem,
                                    face->units_per_EM );

      ft_recompute_scaled_metrics( face, metrics );
    }
    else
    {
      metrics->x_scale     = 1L << 16;
      metrics->y_scale     = 1L << 16;
      metrics->ascender    = bsize->y_ppem;
      metrics->descender   = 0;
      metrics->height      = bsize->height << 6;
      metrics->max_advance = bsize->x_ppem;
    }
  }